

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

PointerType __thiscall capnp::_::PointerReader::getPointerType(PointerReader *this)

{
  SegmentReader *pSVar1;
  word *pwVar2;
  long *plVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  ulong uVar8;
  WirePointer *pWVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  WirePointer *pWVar13;
  WirePointer *pWVar14;
  Fault f;
  undefined8 *puVar7;
  
  pWVar13 = this->pointer;
  if (pWVar13 == (WirePointer *)0x0) {
    return NULL_;
  }
  uVar6 = (pWVar13->offsetAndKind).value;
  if ((pWVar13->field_1).upper32Bits == 0 && uVar6 == 0) {
    return NULL_;
  }
  pSVar1 = this->segment;
  if (pSVar1 != (SegmentReader *)0x0) {
    lVar10 = (long)((int)uVar6 >> 2);
    pwVar2 = (pSVar1->ptr).ptr;
    pWVar14 = (WirePointer *)(pwVar2 + (pSVar1->ptr).size_);
    pWVar9 = pWVar13 + lVar10 + 1;
    if ((long)pWVar14 - (long)(pWVar13 + 1) >> 3 < lVar10) {
      pWVar9 = pWVar14;
    }
    if (lVar10 < (long)pwVar2 - (long)(pWVar13 + 1) >> 3) {
      pWVar9 = pWVar14;
    }
    if ((uVar6 & 3) == 2) {
      iVar5 = (*pSVar1->arena->_vptr_Arena[2])();
      puVar7 = (undefined8 *)CONCAT44(extraout_var,iVar5);
      if (puVar7 == (undefined8 *)0x0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49]>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x234,FAILED,"segment != nullptr",
                   "\"Message contains far pointer to unknown segment.\"",
                   (char (*) [49])"Message contains far pointer to unknown segment.");
        goto LAB_001958f4;
      }
      uVar8 = puVar7[3];
      uVar6 = (pWVar13->offsetAndKind).value;
      uVar11 = (ulong)(uVar6 >> 3);
      if ((long)uVar8 < (long)(ulong)(uVar6 >> 3)) {
        uVar11 = uVar8;
      }
      uVar12 = 2 - (ulong)((uVar6 & 4) == 0);
      if (uVar11 + uVar12 <= uVar8) {
        lVar10 = puVar7[2];
        plVar3 = (long *)*puVar7;
        uVar4 = *(ulong *)puVar7[4];
        if (uVar12 <= uVar4) {
          pWVar14 = (WirePointer *)(lVar10 + uVar11 * 8);
          pWVar13 = pWVar14 + 1;
          *(ulong *)puVar7[4] = uVar4 - uVar12;
          if ((uVar6 & 4) != 0) {
            lVar10 = (**(code **)(*plVar3 + 0x10))(plVar3,(pWVar14->field_1).upper32Bits);
            if (lVar10 == 0) {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[56]>
                        (&f,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x24e,FAILED,"newSegment != nullptr",
                         "\"Message contains double-far pointer to unknown segment.\"",
                         (char (*) [56])"Message contains double-far pointer to unknown segment.");
              goto LAB_001958f4;
            }
            uVar6 = (pWVar14->offsetAndKind).value;
            if ((uVar6 & 3) != 2) {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
                        (&f,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x252,FAILED,"pad->kind() == WirePointer::FAR",
                         "\"Second word of double-far pad must be far pointer.\"",
                         (char (*) [51])"Second word of double-far pad must be far pointer.");
              goto LAB_001958f4;
            }
            uVar8 = (ulong)(uVar6 >> 3);
            if ((long)*(ulong *)(lVar10 + 0x18) < (long)uVar8) {
              uVar8 = *(ulong *)(lVar10 + 0x18);
            }
            pWVar9 = (WirePointer *)(uVar8 * 8 + *(long *)(lVar10 + 0x10));
            goto LAB_0019589e;
          }
          uVar6 = (pWVar14->offsetAndKind).value;
          if ((lVar10 - (long)pWVar13 >> 3 <= (long)((int)uVar6 >> 2)) &&
             ((long)((int)uVar6 >> 2) <= (long)((lVar10 + uVar8 * 8) - (long)pWVar13) >> 3))
          goto LAB_001958a9;
          goto LAB_001958a6;
        }
        (**(code **)(*plVar3 + 0x18))();
      }
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[44]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x23c,FAILED,"boundsCheck(segment, ptr, padWords)",
                 "\"Message contains out-of-bounds far pointer.\"",
                 (char (*) [44])"Message contains out-of-bounds far pointer.");
      goto LAB_001958f4;
    }
LAB_0019589e:
    pWVar14 = pWVar13;
    if (pWVar9 == (WirePointer *)0x0) {
      return NULL_;
    }
LAB_001958a6:
    uVar6 = (pWVar14->offsetAndKind).value;
  }
LAB_001958a9:
  switch(uVar6 & 3) {
  case 0:
    return STRUCT;
  case 1:
    return LIST;
  case 2:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0xaad,FAILED,(char *)0x0,"\"far pointer not followed?\"",
               (char (*) [26])"far pointer not followed?");
    break;
  case 3:
    if (uVar6 == 3) {
      return CAPABILITY;
    }
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0xab3,FAILED,"ptr->isCapability()","\"unknown pointer type\"",
               (char (*) [21])"unknown pointer type");
  }
LAB_001958f4:
  kj::_::Debug::Fault::~Fault(&f);
  return NULL_;
}

Assistant:

PointerType PointerReader::getPointerType() const {
  if(pointer == nullptr || pointer->isNull()) {
    return PointerType::NULL_;
  } else {
    const WirePointer* ptr = pointer;
    const word* refTarget = ptr->target(segment);
    SegmentReader* sgmt = segment;
    if (WireHelpers::followFars(ptr, refTarget, sgmt) == nullptr) return PointerType::NULL_;
    switch(ptr->kind()) {
      case WirePointer::FAR:
        KJ_FAIL_ASSERT("far pointer not followed?") { return PointerType::NULL_; }
      case WirePointer::STRUCT:
        return PointerType::STRUCT;
      case WirePointer::LIST:
        return PointerType::LIST;
      case WirePointer::OTHER:
        KJ_REQUIRE(ptr->isCapability(), "unknown pointer type") { return PointerType::NULL_; }
        return PointerType::CAPABILITY;
    }
    KJ_UNREACHABLE;
  }
}